

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_lore_blow(parser *p)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  parser_error pVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  void *pvVar7;
  char *pcVar8;
  blow_effect *pbVar9;
  long lVar10;
  blow_method *pbVar11;
  random_conflict rVar12;
  undefined8 local_38;
  
  pvVar7 = parser_priv(p);
  if (pvVar7 == (void *)0x0) {
    pVar4 = PARSE_ERROR_NONE;
  }
  else {
    pcVar8 = parser_getsym(p,"method");
    pbVar11 = blow_methods + 1;
    do {
      iVar3 = strcmp(pbVar11->name,pcVar8);
      if (iVar3 == 0) break;
      pbVar11 = pbVar11->next;
    } while (pbVar11 != (blow_method *)0x0);
    if (pbVar11 == (blow_method *)0x0) {
      pVar4 = PARSE_ERROR_UNRECOGNISED_BLOW;
    }
    else {
      _Var2 = parser_hasval(p,"effect");
      if (_Var2) {
        pcVar8 = parser_getsym(p,"effect");
        pbVar9 = findeff(pcVar8);
        if (pbVar9 == (blow_effect *)0x0) {
          return PARSE_ERROR_INVALID_EFFECT;
        }
      }
      else {
        pbVar9 = (blow_effect *)0x0;
      }
      _Var2 = parser_hasval(p,"damage");
      wVar5 = L'\0';
      if (_Var2) {
        rVar12 = parser_getrand(p,"damage");
      }
      else {
        rVar12 = (random_conflict)ZEXT816(0);
      }
      local_38 = rVar12._0_8_;
      _Var2 = parser_hasval(p,"seen");
      if (_Var2) {
        wVar5 = parser_getint(p,"seen");
      }
      _Var2 = parser_hasval(p,"index");
      wVar6 = L'\0';
      if (_Var2) {
        wVar6 = parser_getint(p,"index");
      }
      pVar4 = PARSE_ERROR_TOO_MANY_ENTRIES;
      if (wVar6 < (int)(uint)z_info->mon_blows_max) {
        pVar4 = PARSE_ERROR_NONE;
        if (wVar5 != L'\0') {
          lVar1 = *(long *)((long)pvVar7 + 0x18);
          lVar10 = (long)wVar6 * 0x30;
          *(blow_method **)(lVar1 + 8 + lVar10) = pbVar11;
          *(blow_effect **)(lVar1 + 0x10 + lVar10) = pbVar9;
          *(undefined8 *)(lVar1 + 0x18 + lVar10) = local_38;
          *(long *)(lVar1 + 0x20 + lVar10) = rVar12._8_8_;
          *(wchar_t *)(lVar1 + 0x28 + lVar10) = wVar5;
          pVar4 = PARSE_ERROR_NONE;
        }
      }
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_lore_blow(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct blow_method *method = NULL;
	struct blow_effect *effect = NULL;
	int seen = 0, index = 0;
	struct random dam = { 0, 0, 0, 0 };

	if (!l)
		return PARSE_ERROR_NONE;

	/* Read in all the data */
	method = findmeth(parser_getsym(p, "method"));
	if (!method)
		return PARSE_ERROR_UNRECOGNISED_BLOW;
	if (parser_hasval(p, "effect")) {
		effect = findeff(parser_getsym(p, "effect"));
		if (!effect)
			return PARSE_ERROR_INVALID_EFFECT;
	}
	if (parser_hasval(p, "damage"))
		dam = parser_getrand(p, "damage");
	if (parser_hasval(p, "seen"))
		seen = parser_getint(p, "seen");
	if (parser_hasval(p, "index"))
		index = parser_getint(p, "index");
	if (index >= z_info->mon_blows_max)
		return PARSE_ERROR_TOO_MANY_ENTRIES;

	/* Interpret */
	if (seen) {
		struct monster_blow *b = &l->blows[index];
		b->method = method;
		b->effect = effect;
		b->dice = dam;
		b->times_seen = seen;
	}

	return PARSE_ERROR_NONE;
}